

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::NodeComplexityComputer::visitForStatement
          (NodeComplexityComputer *this,ForStatement *f)

{
  Node *pNVar1;
  Expr *pEVar2;
  ForStatement *in_RSI;
  ForStatement *in_RDI;
  
  pNVar1 = ForStatement::initializer(in_RSI);
  if (pNVar1 != (Node *)0x0) {
    (in_RDI->super_LoopStatement).super_Statement.super_Node._coordinates.lineStart =
         (in_RDI->super_LoopStatement).super_Statement.super_Node._coordinates.lineStart + 1;
  }
  pEVar2 = ForStatement::condition(in_RSI);
  if (pEVar2 != (Expr *)0x0) {
    (in_RDI->super_LoopStatement).super_Statement.super_Node._coordinates.lineStart =
         (in_RDI->super_LoopStatement).super_Statement.super_Node._coordinates.lineStart + 1;
  }
  pEVar2 = ForStatement::modifier(in_RSI);
  if (pEVar2 != (Expr *)0x0) {
    (in_RDI->super_LoopStatement).super_Statement.super_Node._coordinates.lineStart =
         (in_RDI->super_LoopStatement).super_Statement.super_Node._coordinates.lineStart + 1;
  }
  Visitor::visitForStatement((Visitor *)in_RSI,in_RDI);
  return;
}

Assistant:

void visitForStatement(ForStatement *f) {
    if (f->initializer())
      complexity += 1;

    if (f->condition())
      complexity += 1;

    if (f->modifier())
      complexity += 1;

    Visitor::visitForStatement(f);
  }